

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

boolean flush_bits_s(working_state *state)

{
  size_t *psVar1;
  JOCTET *pJVar2;
  jpeg_destination_mgr *pjVar3;
  bool bVar4;
  int iVar5;
  boolean bVar6;
  int iVar7;
  ulong uVar8;
  
  iVar7 = (state->cur).put_bits;
  uVar8 = 0x7fL << (0x11U - (char)iVar7 & 0x3f) | (state->cur).put_buffer;
  iVar7 = iVar7 + 7;
  do {
    iVar5 = iVar7;
    if (iVar5 < 8) {
      (state->cur).put_buffer = uVar8;
      (state->cur).put_bits = iVar5;
      break;
    }
    pJVar2 = state->next_output_byte;
    state->next_output_byte = pJVar2 + 1;
    *pJVar2 = (JOCTET)(uVar8 >> 0x10);
    psVar1 = &state->free_in_buffer;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      pjVar3 = state->cinfo->dest;
      bVar6 = (*pjVar3->empty_output_buffer)(state->cinfo);
      if (bVar6 != 0) {
        state->next_output_byte = pjVar3->next_output_byte;
        state->free_in_buffer = pjVar3->free_in_buffer;
        goto LAB_001171b4;
      }
LAB_00117200:
      bVar4 = false;
      iVar7 = iVar5;
    }
    else {
LAB_001171b4:
      if ((~(uint)uVar8 & 0xff0000) == 0) {
        pJVar2 = state->next_output_byte;
        state->next_output_byte = pJVar2 + 1;
        *pJVar2 = '\0';
        psVar1 = &state->free_in_buffer;
        *psVar1 = *psVar1 - 1;
        if (*psVar1 == 0) {
          pjVar3 = state->cinfo->dest;
          bVar6 = (*pjVar3->empty_output_buffer)(state->cinfo);
          if (bVar6 == 0) goto LAB_00117200;
          state->next_output_byte = pjVar3->next_output_byte;
          state->free_in_buffer = pjVar3->free_in_buffer;
        }
      }
      uVar8 = uVar8 << 8;
      bVar4 = true;
      iVar7 = iVar5 + -8;
    }
  } while (bVar4);
  if (iVar5 < 8) {
    (state->cur).put_buffer = 0;
    (state->cur).put_bits = 0;
  }
  return (uint)(iVar5 < 8);
}

Assistant:

LOCAL(boolean)
flush_bits_s (working_state * state)
{
  if (! emit_bits_s(state, 0x7F, 7)) /* fill any partial byte with ones */
    return FALSE;
  state->cur.put_buffer = 0;	     /* and reset bit-buffer to empty */
  state->cur.put_bits = 0;
  return TRUE;
}